

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# barray.c
# Opt level: O0

void * bit_array_dup(void *array)

{
  size_t __size;
  long *in_RDI;
  void *ret;
  size_t bsize;
  size_t *size;
  undefined8 local_8;
  
  if (in_RDI == (long *)0x0) {
    local_8 = (void *)0x0;
  }
  else {
    __size = (*in_RDI + 7U >> 3) + 8;
    local_8 = malloc(__size);
    if (local_8 != (void *)0x0) {
      memcpy(local_8,in_RDI,__size);
    }
  }
  return local_8;
}

Assistant:

void * bit_array_dup(void * array)
{
	if (array)
	{
		size_t * size = (size_t *) array;
		size_t bsize = ((*size + 7) >> 3) + sizeof(*size);
		void * ret = malloc(bsize);
		if (ret) memcpy(ret, array, bsize);
		return ret;
	}
	return NULL;
}